

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

char_t * pugi::impl::anon_unknown_0::
         strconv_pcdata_impl<pugi::impl::(anonymous_namespace)::opt_true,_pugi::impl::(anonymous_namespace)::opt_true,_pugi::impl::(anonymous_namespace)::opt_false>
         ::parse(char_t *s)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  long lVar4;
  byte *pbVar5;
  
  lVar4 = 0;
  pbVar5 = (byte *)s;
  pbVar3 = (byte *)0x0;
LAB_0012989e:
  pbVar2 = pbVar5 + 3;
  while (bVar1 = pbVar2[-3], ((anonymous_namespace)::chartype_table[bVar1] & 1) == 0) {
    bVar1 = pbVar2[-2];
    if (((anonymous_namespace)::chartype_table[bVar1] & 1) != 0) {
      pbVar2 = pbVar2 + -2;
      goto LAB_001298e9;
    }
    bVar1 = pbVar2[-1];
    if (((anonymous_namespace)::chartype_table[bVar1] & 1) != 0) {
      pbVar2 = pbVar2 + -1;
      goto LAB_001298e9;
    }
    bVar1 = *pbVar2;
    if (((anonymous_namespace)::chartype_table[bVar1] & 1) != 0) goto LAB_001298e9;
    pbVar2 = pbVar2 + 4;
  }
  pbVar2 = pbVar2 + -3;
LAB_001298e9:
  if (bVar1 == 0xd) {
    pbVar5 = pbVar2 + 1;
    *pbVar2 = 10;
    if (pbVar2[1] == 10) {
      if (pbVar3 != (byte *)0x0) {
        memmove(pbVar3 + -lVar4,pbVar3,(long)pbVar5 - (long)pbVar3);
      }
      pbVar5 = pbVar2 + 2;
      lVar4 = lVar4 + 1;
      pbVar3 = pbVar5;
    }
    goto LAB_0012989e;
  }
  if (bVar1 == 0) {
    pbVar5 = pbVar2;
    if (pbVar3 != (byte *)0x0) {
      memmove(pbVar3 + -lVar4,pbVar3,(long)pbVar2 - (long)pbVar3);
      pbVar5 = pbVar2 + -lVar4;
    }
    goto LAB_00129992;
  }
  if (bVar1 != 0x3c) {
    pbVar5 = pbVar2 + 1;
    goto LAB_0012989e;
  }
  pbVar5 = pbVar2;
  if (pbVar3 != (byte *)0x0) {
    memmove(pbVar3 + -lVar4,pbVar3,(long)pbVar2 - (long)pbVar3);
    pbVar5 = pbVar2 + -lVar4;
  }
  do {
    pbVar3 = pbVar5;
    if (pbVar3 <= s) break;
    pbVar5 = pbVar3 + -1;
  } while (((anonymous_namespace)::chartype_table[pbVar3[-1]] & 8) != 0);
  *pbVar3 = 0;
  return (char_t *)(pbVar2 + 1);
  while (pbVar5 = pbVar3 + -1, ((anonymous_namespace)::chartype_table[pbVar3[-1]] & 8) != 0) {
LAB_00129992:
    pbVar3 = pbVar5;
    if (pbVar3 <= s) break;
  }
  *pbVar3 = 0;
  return (char_t *)pbVar2;
}

Assistant:

static char_t* parse(char_t* s)
		{
			gap g;

			char_t* begin = s;

			while (true)
			{
				PUGI_IMPL_SCANWHILE_UNROLL(!PUGI_IMPL_IS_CHARTYPE(ss, ct_parse_pcdata));

				if (*s == '<') // PCDATA ends here
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI_IMPL_IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s + 1;
				}
				else if (opt_eol::value && *s == '\r') // Either a single 0x0d or 0x0d 0x0a pair
				{
					*s++ = '\n'; // replace first one with 0x0a

					if (*s == '\n') g.push(s, 1);
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (*s == 0)
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI_IMPL_IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s;
				}
				else ++s;
			}
		}